

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall
cmCTestRunTest::cmCTestRunTest(cmCTestRunTest *this,cmCTestMultiProcessHandler *multiHandler)

{
  duration<double,_std::ratio<1L,_1L>_> dVar1;
  cmCTestMultiProcessHandler *multiHandler_local;
  cmCTestRunTest *this_local;
  
  this->TimeoutIsForStopTime = false;
  std::unique_ptr<cmProcess,std::default_delete<cmProcess>>::
  unique_ptr<std::default_delete<cmProcess>,void>
            ((unique_ptr<cmProcess,std::default_delete<cmProcess>> *)&this->TestProcess);
  std::__cxx11::string::string((string *)&this->ProcessOutput);
  cmCTestTestHandler::cmCTestTestResult::cmCTestTestResult(&this->TestResult);
  this->MultiTestHandler = multiHandler;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->FailedDependencies);
  std::__cxx11::string::string((string *)&this->StartTime);
  std::__cxx11::string::string((string *)&this->ActualCommand);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Arguments);
  this->UseAllocatedResources = false;
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
  ::vector(&this->AllocatedResources);
  this->RepeatMode = Never;
  this->NumberOfRunsLeft = 1;
  this->NumberOfRunsTotal = 1;
  this->RunAgain = false;
  this->CTest = multiHandler->CTest;
  this->TestHandler = multiHandler->TestHandler;
  dVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  (this->TestResult).ExecutionTime.__r = dVar1.__r;
  (this->TestResult).ReturnValue = 0;
  (this->TestResult).Status = 0;
  (this->TestResult).TestCount = 0;
  (this->TestResult).Properties = (cmCTestTestProperties *)0x0;
  return;
}

Assistant:

cmCTestRunTest::cmCTestRunTest(cmCTestMultiProcessHandler& multiHandler)
  : MultiTestHandler(multiHandler)
{
  this->CTest = multiHandler.CTest;
  this->TestHandler = multiHandler.TestHandler;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.ReturnValue = 0;
  this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
  this->TestResult.TestCount = 0;
  this->TestResult.Properties = nullptr;
}